

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::LogToTTY(int auto_open_depth)

{
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  if (GImGui->LogEnabled == false) {
    LogBegin(ImGuiLogType_TTY,auto_open_depth);
    pIVar1->LogFile = _stdout;
  }
  return;
}

Assistant:

void ImGui::LogToTTY(int auto_open_depth)
{
    ImGuiContext& g = *GImGui;
    if (g.LogEnabled)
        return;
    IM_UNUSED(auto_open_depth);
#ifndef IMGUI_DISABLE_TTY_FUNCTIONS
    LogBegin(ImGuiLogType_TTY, auto_open_depth);
    g.LogFile = stdout;
#endif
}